

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

bool costScaleOk(vector<double,_std::allocator<double>_> *cost,HighsInt cost_scale,
                double infinite_cost)

{
  double dVar1;
  pointer pdVar2;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  
  if (cost_scale != 0) {
    dVar5 = ldexp(1.0,cost_scale);
    pdVar2 = (cost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (uint)((ulong)((long)(cost->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                 .super__Vector_impl_data._M_finish - (long)pdVar2) >> 3);
    if (0 < (int)uVar3) {
      uVar4 = 0;
      do {
        dVar1 = pdVar2[uVar4];
        if (((ulong)ABS(dVar1) < 0x7ff0000000000000) && (infinite_cost < ABS(dVar1 * dVar5))) {
          return false;
        }
        uVar4 = uVar4 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar4);
    }
  }
  return true;
}

Assistant:

bool costScaleOk(const vector<double>& cost, const HighsInt cost_scale,
                 const double infinite_cost) {
  if (!cost_scale) return true;
  double cost_scale_value = std::pow(2, cost_scale);
  for (HighsInt iCol = 0; iCol < HighsInt(cost.size()); iCol++)
    if (std::abs(cost[iCol]) < kHighsInf &&
        std::abs(cost[iCol] * cost_scale_value) > infinite_cost)
      return false;
  return true;
}